

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueArrayCase::test(UniformValueArrayCase *this)

{
  TestContext *pTVar1;
  char *pcVar2;
  bool bVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  GLint GVar6;
  RenderContext *renderCtx;
  float afStack_268 [2];
  float uniformValue [20];
  GLint location;
  string local_208;
  allocator<char> local_1d1;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  UniformValueArrayCase *this_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)this;
  renderCtx = gles2::Context::getRenderContext((this->super_ApiCase).super_TestCase.m_context);
  pcVar2 = test::testVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,pcVar2,&local_1d1);
  pcVar2 = test::testFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,pcVar2,(allocator<char> *)((long)&location + 3));
  glu::makeVtxFragSources(&local_1b0,&local_1d0,&local_208);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)((long)&location + 3));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_e0);
  if (bVar3) {
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    glu::CallLogWrapper::glUseProgram(&(this->super_ApiCase).super_CallLogWrapper,dVar4);
    ApiCase::expectError(&this->super_ApiCase,0);
    uniformValue[0xe] = 95.0;
    uniformValue[0xf] = 77.0;
    uniformValue[0x10] = 32.0;
    uniformValue[0x11] = 48.0;
    uniformValue[10] = 41.0;
    uniformValue[0xb] = 65.0;
    uniformValue[0xc] = 4.0;
    uniformValue[0xd] = 12.2;
    uniformValue[6] = -55.1;
    uniformValue[7] = 1.1;
    uniformValue[8] = 98.0;
    uniformValue[9] = 19.0;
    uniformValue[2] = 13.0;
    uniformValue[3] = 55.0;
    uniformValue[4] = 12.0;
    uniformValue[5] = 91.0;
    afStack_268[0] = -1.0;
    afStack_268[1] = 0.1;
    uniformValue[0] = 4.0;
    uniformValue[1] = 800.0;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    uniformValue[0x13] =
         (float)glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_ApiCase).super_CallLogWrapper,dVar4,"arrayUniform");
    glu::CallLogWrapper::glUniform1fv
              (&(this->super_ApiCase).super_CallLogWrapper,(GLint)uniformValue[0x13],5,afStack_268);
    ApiCase::expectError(&this->super_ApiCase,0);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"arrayUniform[0]");
    verifyUniformValue1f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,afStack_268[0]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"arrayUniform[1]");
    verifyUniformValue1f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,afStack_268[1]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"arrayUniform[2]");
    verifyUniformValue1f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[0]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"arrayUniform[3]");
    verifyUniformValue1f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[1]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"arrayUniform[4]");
    verifyUniformValue1f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[2]);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    uniformValue[0x13] =
         (float)glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_ApiCase).super_CallLogWrapper,dVar4,"array2Uniform");
    glu::CallLogWrapper::glUniform2fv
              (&(this->super_ApiCase).super_CallLogWrapper,(GLint)uniformValue[0x13],5,afStack_268);
    ApiCase::expectError(&this->super_ApiCase,0);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array2Uniform[0]");
    verifyUniformValue2f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,afStack_268[0],
               afStack_268[1]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array2Uniform[1]");
    verifyUniformValue2f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[0],
               uniformValue[1]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array2Uniform[2]");
    verifyUniformValue2f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[2],
               uniformValue[3]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array2Uniform[3]");
    verifyUniformValue2f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[4],
               uniformValue[5]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array2Uniform[4]");
    verifyUniformValue2f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[6],
               uniformValue[7]);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    uniformValue[0x13] =
         (float)glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_ApiCase).super_CallLogWrapper,dVar4,"array3Uniform");
    glu::CallLogWrapper::glUniform3fv
              (&(this->super_ApiCase).super_CallLogWrapper,(GLint)uniformValue[0x13],5,afStack_268);
    ApiCase::expectError(&this->super_ApiCase,0);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array3Uniform[0]");
    verifyUniformValue3f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,afStack_268[0],
               afStack_268[1],uniformValue[0]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array3Uniform[1]");
    verifyUniformValue3f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[1],
               uniformValue[2],uniformValue[3]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array3Uniform[2]");
    verifyUniformValue3f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[4],
               uniformValue[5],uniformValue[6]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array3Uniform[3]");
    verifyUniformValue3f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[7],
               uniformValue[8],uniformValue[9]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array3Uniform[4]");
    verifyUniformValue3f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[10],
               uniformValue[0xb],uniformValue[0xc]);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    uniformValue[0x13] =
         (float)glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_ApiCase).super_CallLogWrapper,dVar4,"array4Uniform");
    glu::CallLogWrapper::glUniform4fv
              (&(this->super_ApiCase).super_CallLogWrapper,(GLint)uniformValue[0x13],5,afStack_268);
    ApiCase::expectError(&this->super_ApiCase,0);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array4Uniform[0]");
    verifyUniformValue4f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,afStack_268[0],
               afStack_268[1],uniformValue[0],uniformValue[1]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array4Uniform[1]");
    verifyUniformValue4f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[2],
               uniformValue[3],uniformValue[4],uniformValue[5]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array4Uniform[2]");
    verifyUniformValue4f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[6],
               uniformValue[7],uniformValue[8],uniformValue[9]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array4Uniform[3]");
    verifyUniformValue4f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[10],
               uniformValue[0xb],uniformValue[0xc],uniformValue[0xd]);
    pTVar1 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar6 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ApiCase).super_CallLogWrapper,dVar5,"array4Uniform[4]");
    verifyUniformValue4f
              (pTVar1,&(this->super_ApiCase).super_CallLogWrapper,dVar4,GVar6,uniformValue[0xe],
               uniformValue[0xf],uniformValue[0x10],uniformValue[0x11]);
    ApiCase::expectError(&this->super_ApiCase,0);
    glu::CallLogWrapper::glUseProgram(&(this->super_ApiCase).super_CallLogWrapper,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  else {
    glu::operator<<((this->super_ApiCase).m_log,(ShaderProgram *)local_e0);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"uniform highp float arrayUniform[5];"
			"uniform highp vec2 array2Uniform[5];"
			"uniform highp vec3 array3Uniform[5];"
			"uniform highp vec4 array4Uniform[5];"
			"void main (void)\n"
			"{\n"
			"	gl_Position = \n"
			"		+ vec4(arrayUniform[0]		+ arrayUniform[1]		+ arrayUniform[2]		+ arrayUniform[3]		+ arrayUniform[4])\n"
			"		+ vec4(array2Uniform[0].x	+ array2Uniform[1].x	+ array2Uniform[2].x	+ array2Uniform[3].x	+ array2Uniform[4].x)\n"
			"		+ vec4(array3Uniform[0].x	+ array3Uniform[1].x	+ array3Uniform[2].x	+ array3Uniform[3].x	+ array3Uniform[4].x)\n"
			"		+ vec4(array4Uniform[0].x	+ array4Uniform[1].x	+ array4Uniform[2].x	+ array4Uniform[3].x	+ array4Uniform[4].x);\n"
			"}\n";
		static const char* testFragSource =

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		float uniformValue[5 * 4] =
		{
			-1.0f,	0.1f,	4.0f,	800.0f,
			13.0f,	55.0f,	12.0f,	91.0f,
			-55.1f,	1.1f,	98.0f,	19.0f,
			41.0f,	65.0f,	4.0f,	12.2f,
			95.0f,	77.0f,	32.0f,	48.0f
		};

		location = glGetUniformLocation(program.getProgram(), "arrayUniform");
		glUniform1fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[0]"), uniformValue[0]);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[1]"), uniformValue[1]);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[2]"), uniformValue[2]);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[3]"), uniformValue[3]);
		verifyUniformValue1f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "arrayUniform[4]"), uniformValue[4]);
		expectError(GL_NO_ERROR);

		location = glGetUniformLocation(program.getProgram(),"array2Uniform");
		glUniform2fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[0]"), uniformValue[2 * 0], uniformValue[(2 * 0) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[1]"), uniformValue[2 * 1], uniformValue[(2 * 1) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[2]"), uniformValue[2 * 2], uniformValue[(2 * 2) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[3]"), uniformValue[2 * 3], uniformValue[(2 * 3) + 1]);
		verifyUniformValue2f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array2Uniform[4]"), uniformValue[2 * 4], uniformValue[(2 * 4) + 1]);
		expectError(GL_NO_ERROR);

		location = glGetUniformLocation(program.getProgram(),"array3Uniform");
		glUniform3fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[0]"), uniformValue[3 * 0], uniformValue[(3 * 0) + 1], uniformValue[(3 * 0) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[1]"), uniformValue[3 * 1], uniformValue[(3 * 1) + 1], uniformValue[(3 * 1) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[2]"), uniformValue[3 * 2], uniformValue[(3 * 2) + 1], uniformValue[(3 * 2) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[3]"), uniformValue[3 * 3], uniformValue[(3 * 3) + 1], uniformValue[(3 * 3) + 2]);
		verifyUniformValue3f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array3Uniform[4]"), uniformValue[3 * 4], uniformValue[(3 * 4) + 1], uniformValue[(3 * 4) + 2]);
		expectError(GL_NO_ERROR);

		location = glGetUniformLocation(program.getProgram(),"array4Uniform");
		glUniform4fv(location, 5, uniformValue);
		expectError(GL_NO_ERROR);

		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[0]"), uniformValue[4 * 0], uniformValue[(4 * 0) + 1], uniformValue[(4 * 0) + 2], uniformValue[(4 * 0) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[1]"), uniformValue[4 * 1], uniformValue[(4 * 1) + 1], uniformValue[(4 * 1) + 2], uniformValue[(4 * 1) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[2]"), uniformValue[4 * 2], uniformValue[(4 * 2) + 1], uniformValue[(4 * 2) + 2], uniformValue[(4 * 2) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[3]"), uniformValue[4 * 3], uniformValue[(4 * 3) + 1], uniformValue[(4 * 3) + 2], uniformValue[(4 * 3) + 3]);
		verifyUniformValue4f(m_testCtx, *this, program.getProgram(), glGetUniformLocation(program.getProgram(), "array4Uniform[4]"), uniformValue[4 * 4], uniformValue[(4 * 4) + 1], uniformValue[(4 * 4) + 2], uniformValue[(4 * 4) + 3]);
		expectError(GL_NO_ERROR);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}